

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_keytrans.cpp
# Opt level: O2

bool find_str_and_remove(char *s,char *target)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  
  sVar3 = strlen(target);
  sVar4 = strlen(s);
  uVar10 = 0;
  uVar8 = 0;
  if (0 < (int)sVar3) {
    uVar8 = sVar3 & 0xffffffff;
  }
  iVar2 = (int)sVar4;
  uVar7 = 0;
  pcVar9 = s;
  if (0 < iVar2) {
    uVar7 = sVar4 & 0xffffffff;
  }
  do {
    if (uVar10 == uVar7) {
LAB_001ac70b:
      return (long)uVar10 < (long)iVar2;
    }
    uVar11 = 0;
    bVar6 = false;
    do {
      if (uVar8 == uVar11) {
        if (bVar6) {
          for (lVar5 = (long)(int)sVar3; lVar5 <= iVar2; lVar5 = lVar5 + 1) {
            *pcVar9 = s[lVar5];
            pcVar9 = pcVar9 + 1;
          }
          goto LAB_001ac70b;
        }
        break;
      }
      bVar1 = case_compare(pcVar9[uVar11],target[uVar11]);
      uVar11 = uVar11 + 1;
      bVar6 = true;
    } while (bVar1);
    uVar10 = uVar10 + 1;
    sVar3 = (size_t)((int)sVar3 + 1);
    pcVar9 = pcVar9 + 1;
  } while( true );
}

Assistant:

bool
find_str_and_remove(char *s, const char *target)
{
  // uses a dumb algorithm
  int start, i, j;
  int len = strlen(target);
  int tot_len = strlen(s);
  bool matches = false;
  for (i = 0; i < tot_len; i++) {
    start = i;
    for (j = 0; j < len; j++) {
      if (case_compare(s[i + j], target[j]))
        matches = true;
      else {
        matches = false;
        break;
      }
    }
    if (matches) {
      for (i = start, j = start + len; j <= tot_len; i++, j++)
        // use <= on j so also copies the zero at the end
        s[i] = s[j];
      return true;
    }
  }
  // if get to here, then no match
  return false;
}